

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

IString __thiscall wasm::Wasm2JSBuilder::fromName(Wasm2JSBuilder *this,Name name,NameScope scope)

{
  ulong uVar1;
  long *plVar2;
  _Hash_node_base *p_Var3;
  IString *this_00;
  size_type sVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  undefined4 in_register_0000000c;
  char *pcVar7;
  char *pcVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  int iVar11;
  string_view s;
  Name name_00;
  ostringstream local_250 [8];
  ostringstream out;
  ios_base local_1e0 [264];
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  ostream *local_98;
  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_90;
  _Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_88;
  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_80;
  undefined1 local_78 [8];
  string mangled;
  __node_gen_type __node_gen;
  string_view local_48;
  NameScope local_34;
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  local_98 = name.super_IString.str._M_len;
  uVar1 = this->wasmNameToMangledName[(int)scope]._M_h._M_bucket_count;
  pcVar8 = (char *)((ulong)name_00.super_IString.str._M_len % uVar1);
  p_Var9 = this->wasmNameToMangledName[(int)scope]._M_h._M_buckets[(long)pcVar8];
  pcVar7 = (char *)CONCAT44(in_register_0000000c,scope);
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var9->_M_nxt, p_Var10 = p_Var9,
     p_Var9->_M_nxt[1]._M_nxt != name_00.super_IString.str._M_len)) {
    while (p_Var9 = p_Var3, p_Var3 = p_Var9->_M_nxt, pcVar7 = pcVar8,
          p_Var3 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((char *)((ulong)p_Var3[1]._M_nxt % uVar1) != pcVar8) ||
         (p_Var10 = p_Var9, p_Var3[1]._M_nxt == name_00.super_IString.str._M_len))
      goto LAB_00d19f51;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00d19f51:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var10->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    return (IString)*(string_view *)(p_Var3 + 2);
  }
  local_88 = (_Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)(this->wasmNameToMangledName + (int)scope);
  local_80 = &this->mangledNames[(int)scope]._M_h;
  local_90 = &this->mangledNames[1]._M_h;
  local_48 = (string_view)ZEXT816(0);
  iVar11 = 0;
  local_34 = scope;
  do {
    std::__cxx11::ostringstream::ostringstream(local_250);
    name_00.super_IString.str._M_str = pcVar7;
    wasm::operator<<((wasm *)local_250,local_98,name_00);
    if (iVar11 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"_",1);
      std::ostream::operator<<(local_250,iVar11);
    }
    std::__cxx11::stringbuf::str();
    asmangle((string *)local_78,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,local_78,mangled._M_dataplus._M_p + (long)local_78);
    plVar2 = local_b8[0];
    this_00 = (IString *)strlen((char *)local_b8[0]);
    s._M_str = (char *)0x0;
    s._M_len = (size_t)plVar2;
    local_48 = IString::interned(this_00,s,SUB81(pcVar7,0));
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    sVar4 = std::
            _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(local_80,(key_type *)&local_48);
    if (sVar4 == 0) {
      if ((local_34 != Local) ||
         (sVar4 = std::
                  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(local_90,(key_type *)&local_48), sVar4 == 0)) {
        mangled.field_2._8_8_ = local_80;
        std::
        _Hashtable<wasm::IString,wasm::IString,std::allocator<wasm::IString>,std::__detail::_Identity,std::equal_to<wasm::IString>,std::hash<wasm::IString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::IString_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::IString,true>>>>
                  ((_Hashtable<wasm::IString,wasm::IString,std::allocator<wasm::IString>,std::__detail::_Identity,std::equal_to<wasm::IString>,std::hash<wasm::IString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_80,&local_48);
        mangled.field_2._8_8_ = name_00.super_IString.str._M_len;
        pmVar6 = std::__detail::
                 _Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_88,(key_type *)((long)&mangled.field_2 + 8));
        (pmVar6->str)._M_len = local_48._M_len;
        (pmVar6->str)._M_str = local_48._M_str;
        if (local_78 != (undefined1  [8])&mangled._M_string_length) {
          operator_delete((void *)local_78,mangled._M_string_length + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_250);
        std::ios_base::~ios_base(local_1e0);
        return (IString)local_48;
      }
    }
    else if (local_34 == Export) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"wasm2js: warning: export names colliding: ",0x2a);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_78,(long)mangled._M_dataplus._M_p);
      mangled.field_2._M_local_buf[8] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,mangled.field_2._M_local_buf + 8,1);
    }
    if (local_78 != (undefined1  [8])&mangled._M_string_length) {
      operator_delete((void *)local_78,mangled._M_string_length + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_250);
    std::ios_base::~ios_base(local_1e0);
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

IString fromName(Name name, NameScope scope) {
    // TODO: checking names do not collide after mangling

    // First up check our cached of mangled names to avoid doing extra work
    // below
    auto& map = wasmNameToMangledName[(int)scope];
    auto it = map.find(name.str.data());
    if (it != map.end()) {
      return it->second;
    }
    // The mangled names in our scope.
    auto& scopeMangledNames = mangledNames[(int)scope];
    // In some cases (see below) we need to also check the Top scope.
    auto& topMangledNames = mangledNames[int(NameScope::Top)];

    // This is the first time we've seen the `name` and `scope` pair. Generate a
    // globally unique name based on `name` and then register that in our cache
    // and return it.
    //
    // Identifiers here generated are of the form `${name}_${n}` where `_${n}`
    // is omitted if `n==0` and otherwise `n` is just looped over to find the
    // next unused identifier.
    IString ret;
    for (int i = 0;; i++) {
      std::ostringstream out;
      out << name;
      if (i > 0) {
        out << "_" << i;
      }
      auto mangled = asmangle(out.str());
      ret = stringToIString(mangled);
      if (scopeMangledNames.count(ret)) {
        // When export names collide things may be confusing, as this is
        // observable externally by the person using the JS. Report a warning.
        if (scope == NameScope::Export) {
          std::cerr << "wasm2js: warning: export names colliding: " << mangled
                    << '\n';
        }
        continue;
      }
      // The Local scope is special: a Local name must not collide with a Top
      // name, as they are in a single namespace in JS and can conflict:
      //
      // function foo(bar) {
      //   var bar = 0;
      // }
      // function bar() { ..
      if (scope == NameScope::Local && topMangledNames.count(ret)) {
        continue;
      }
      // We found a good name, use it.
      scopeMangledNames.insert(ret);
      map[name.str.data()] = ret;
      return ret;
    }
  }